

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O2

DdNode * Llb_NonlinComputeInitState(Aig_Man_t *pAig,DdManager *dd)

{
  abctime aVar1;
  int iVar2;
  DdNode *n;
  void *pvVar3;
  DdNode *pDVar4;
  int iVar5;
  int i;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (iVar5 = 0; iVar5 < pAig->nRegs; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar5);
    iVar2 = Cudd_ReadSize(dd);
    i = iVar5;
    if (iVar2 != pAig->nRegs) {
      i = *(int *)((long)pvVar3 + 0x24);
    }
    pDVar4 = Cudd_bddIthVar(dd,i);
    pDVar4 = Cudd_bddAnd(dd,n,(DdNode *)((ulong)pDVar4 ^ 1));
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar4;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return n;
}

Assistant:

DdNode * Llb_NonlinComputeInitState( Aig_Man_t * pAig, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        iVar = (Cudd_ReadSize(dd) == Aig_ManRegNum(pAig)) ? i : Aig_ObjId(pObj);
        bVar = Cudd_bddIthVar( dd, iVar );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}